

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfactoryloader.cpp
# Opt level: O1

QObject * __thiscall QFactoryLoader::instance(QFactoryLoader *this,int index)

{
  QMutex *this_00;
  __pointer_type copy;
  QObject *pQVar1;
  bool bVar2;
  
  if (index < 0) {
    return (QObject *)0x0;
  }
  this_00 = &(this->d).mutex;
  if ((this->d).mutex.super_QBasicMutex.d_ptr._q_value._M_b._M_p == (__pointer_type)0x0) {
    LOCK();
    bVar2 = (this_00->super_QBasicMutex).d_ptr._q_value._M_b._M_p == (__pointer_type)0x0;
    if (bVar2) {
      (this_00->super_QBasicMutex).d_ptr._q_value._M_b._M_p = (__pointer_type)0x1;
    }
    UNLOCK();
    if (bVar2) goto LAB_002d92ec;
  }
  QBasicMutex::lockInternal(&this_00->super_QBasicMutex);
LAB_002d92ec:
  pQVar1 = instanceHelper_locked(this,index);
  if ((pQVar1 != (QObject *)0x0) && (((pQVar1->d_ptr).d)->parent == (QObject *)0x0)) {
    QCoreApplicationPrivate::mainThread();
    QObject::moveToThread(pQVar1);
  }
  LOCK();
  copy = (this_00->super_QBasicMutex).d_ptr._q_value._M_b._M_p;
  (this_00->super_QBasicMutex).d_ptr._q_value._M_b._M_p = (__pointer_type)0x0;
  UNLOCK();
  if (copy != (__pointer_type)0x1) {
    QBasicMutex::unlockInternalFutex(&this_00->super_QBasicMutex,copy);
  }
  return pQVar1;
}

Assistant:

QObject *QFactoryLoader::instance(int index) const
{
    if (index < 0)
        return nullptr;

    QMutexLocker lock(&d->mutex);
    QObject *obj = instanceHelper_locked(index);

    if (obj && !obj->parent())
        obj->moveToThread(QCoreApplicationPrivate::mainThread());
    return obj;
}